

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Refal2::CParser::parsingBlank(CParser *this)

{
  bool bVar1;
  CParser *this_local;
  
  if (((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type == TT_Word
      ) && (bVar1 = CDirectiveParser::StartParseIfDirective(&this->super_CDirectiveParser), bVar1))
  {
    this->state = (TState)parsingDirective;
    *(undefined8 *)&this->field_0x1f68 = 0;
  }
  else if ((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type ==
           TT_LineFeed) {
    this->state = (TState)parsingInitial;
    *(undefined8 *)&this->field_0x1f68 = 0;
  }
  else {
    bVar1 = CRuleParser::BeginRule((CRuleParser *)this);
    if (bVar1) {
      this->state = (TState)parsingRule;
      *(undefined8 *)&this->field_0x1f68 = 0;
      AddToken(this);
    }
    else {
      this->state = (TState)parsingIgnoreLine;
      *(undefined8 *)&this->field_0x1f68 = 0;
    }
  }
  return;
}

Assistant:

void CParser::parsingBlank()
{
	if( token.type == TT_Word && CDirectiveParser::StartParseIfDirective() ) {
		state = &CParser::parsingDirective;
	} else if( token.type == TT_LineFeed ) {
		state = &CParser::parsingInitial;
	} else {
		if( !CRuleParser::BeginRule() ) {
			state = &CParser::parsingIgnoreLine;
			return;
		}
		state = &CParser::parsingRule;
		AddToken();
	}
}